

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O2

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  undefined1 *puVar1;
  curl_off_t *pcVar2;
  char cVar3;
  Curl_easy *data;
  _Bool _Var4;
  byte bVar5;
  anon_enum_32 aVar6;
  CURLcode CVar7;
  int iVar8;
  CHUNKcode CVar9;
  CURLcode CVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  timediff_t tVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  size_t size;
  char *pcVar18;
  http_connect_state *datap;
  bool bVar19;
  Curl_send_buffer *req_buffer;
  char *local_90;
  int local_84;
  int *local_80;
  char *local_78;
  char *local_70;
  curl_off_t *local_68;
  curl_socket_t local_60;
  int subversion;
  long local_58;
  int *local_50;
  ssize_t tookcareof;
  curl_off_t *local_40;
  CURLcode extra;
  
  datap = conn->connect_state;
  local_84 = sockindex;
  if (datap == (http_connect_state *)0x0) {
    CVar7 = connect_init(conn,false);
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    datap = conn->connect_state;
  }
  subversion = 0;
  if ((datap != (http_connect_state *)0x0) && (datap->tunnel_state != TUNNEL_COMPLETE)) {
    data = conn->data;
    local_58 = (long)local_84;
    local_60 = conn->sock[local_58];
    puVar1 = &(conn->bits).field_0x7;
    *puVar1 = *puVar1 & 0xfe;
    local_40 = &(data->info).request_size;
    local_50 = &datap->perline;
    local_80 = &(data->req).httpcode;
    local_68 = &datap->cl;
    do {
      aVar6 = datap->tunnel_state;
      do {
        if (aVar6 == TUNNEL_INIT) {
          Curl_infof(data,"Establish HTTP proxy tunnel to %s:%d\n",hostname,(ulong)(uint)remote_port
                    );
          (*Curl_cfree)((data->req).newurl);
          (data->req).newurl = (char *)0x0;
          req_buffer = Curl_add_buffer_init();
          if (req_buffer != (Curl_send_buffer *)0x0) {
            local_70 = hostname;
            pcVar11 = curl_maprintf("%s:%d",hostname,(ulong)(uint)remote_port);
            if (pcVar11 != (char *)0x0) {
              CVar7 = Curl_http_output_auth(conn,"CONNECT",pcVar11,true);
              (*Curl_cfree)(pcVar11);
              pcVar11 = local_70;
              if (CVar7 == CURLE_OK) {
                local_90 = "1.1";
                if ((conn->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
                  local_90 = "1.0";
                }
                if ((conn->host).name == local_70) {
                  bVar19 = (bool)(((conn->bits).field_0x5 & 4) >> 2);
                }
                else {
                  pcVar12 = strchr(local_70,0x3a);
                  bVar19 = pcVar12 != (char *)0x0;
                }
                pcVar17 = "";
                pcVar12 = "";
                if (bVar19 != false) {
                  pcVar12 = "[";
                  pcVar17 = "]";
                }
                local_78 = curl_maprintf("%s%s%s:%d",pcVar12,pcVar11,pcVar17,
                                         (ulong)(uint)remote_port);
                if (local_78 == (char *)0x0) goto LAB_0013624c;
                pcVar11 = Curl_checkProxyheaders(conn,"Host");
                if (pcVar11 == (char *)0x0) {
                  pcVar11 = curl_maprintf("Host: %s\r\n",local_78);
                  if (pcVar11 == (char *)0x0) {
                    (*Curl_cfree)(local_78);
                    goto LAB_0013624c;
                  }
                }
                else {
                  pcVar11 = (char *)0x0;
                }
                pcVar12 = Curl_checkProxyheaders(conn,"Proxy-Connection");
                pcVar17 = "";
                if (pcVar12 == (char *)0x0) {
                  pcVar17 = "Proxy-Connection: Keep-Alive\r\n";
                }
                pcVar13 = Curl_checkProxyheaders(conn,"User-Agent");
                pcVar12 = "";
                if ((pcVar13 == (char *)0x0) && (pcVar12 = "", (data->set).str[0x26] != (char *)0x0)
                   ) {
                  pcVar12 = (conn->allocptr).uagent;
                }
                pcVar13 = pcVar11;
                if (pcVar11 == (char *)0x0) {
                  pcVar13 = "";
                }
                pcVar18 = (conn->allocptr).proxyuserpwd;
                if (pcVar18 == (char *)0x0) {
                  pcVar18 = "";
                }
                CVar7 = Curl_add_bufferf(&req_buffer,"CONNECT %s HTTP/%s\r\n%s%s%s%s",local_78,
                                         local_90,pcVar13,pcVar18,pcVar12,pcVar17);
                local_90 = (char *)CONCAT44(local_90._4_4_,CVar7);
                if (pcVar11 != (char *)0x0) {
                  (*Curl_cfree)(pcVar11);
                }
                (*Curl_cfree)(local_78);
                if ((CURLcode)local_90 == 0) {
                  CVar7 = Curl_add_custom_headers(conn,true,req_buffer);
                  local_90 = (char *)CONCAT44(local_90._4_4_,CVar7);
                  if (CVar7 == CURLE_OK) {
                    CVar7 = Curl_add_bufferf(&req_buffer,"\r\n");
                    local_90 = (char *)CONCAT44(local_90._4_4_,CVar7);
                    if (CVar7 == CURLE_OK) {
                      CVar7 = CURLE_OK;
                      CVar10 = Curl_add_buffer_send(&req_buffer,conn,local_40,0,local_84);
                      req_buffer = (Curl_send_buffer *)0x0;
                      local_90 = (char *)CONCAT44(local_90._4_4_,CVar10);
                      if (CVar10 == CURLE_OK) goto LAB_00135a36;
                    }
                  }
                }
                req_buffer = (Curl_send_buffer *)0x0;
                Curl_failf(data,"Failed sending CONNECT to proxy");
                CVar7 = (CURLcode)local_90;
              }
LAB_00135a36:
              Curl_add_buffer_free(&req_buffer);
              if (CVar7 == CURLE_OK) {
                datap->tunnel_state = TUNNEL_CONNECT;
                datap->perline = 0;
                hostname = local_70;
                goto LAB_00135a5f;
              }
              goto LAB_001360ad;
            }
LAB_0013624c:
            Curl_add_buffer_free(&req_buffer);
          }
          CVar7 = CURLE_OUT_OF_MEMORY;
          goto LAB_001360ad;
        }
LAB_00135a5f:
        tVar14 = Curl_timeleft(data,(curltime *)0x0,true);
        if (tVar14 < 1) {
          Curl_failf(data,"Proxy CONNECT aborted due to timeout");
          CVar7 = CURLE_OPERATION_TIMEDOUT;
          goto LAB_001360ad;
        }
        _Var4 = Curl_conn_data_pending(conn,local_84);
        if (!_Var4) goto LAB_00135726;
LAB_00135a89:
        do {
          while( true ) {
            if (datap->keepon == 0) goto LAB_00135fbe;
            if (local_50 <= datap->ptr) {
              Curl_failf(data,"CONNECT response too large!");
              goto LAB_001360a5;
            }
            CVar7 = Curl_read(conn,local_60,datap->ptr,1,(ssize_t *)&req_buffer);
            if (CVar7 == CURLE_AGAIN) goto LAB_00135726;
            iVar8 = Curl_pgrsUpdate(conn);
            if (iVar8 != 0) {
              CVar7 = CURLE_ABORTED_BY_CALLBACK;
              goto LAB_001360ad;
            }
            if (CVar7 != CURLE_OK) {
              datap->keepon = 0;
              goto LAB_00135fbe;
            }
            if ((long)req_buffer < 1) {
              if (((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) {
                Curl_failf(data,"Proxy CONNECT aborted");
                bVar19 = true;
              }
              else {
                puVar1 = &(conn->bits).field_0x7;
                *puVar1 = *puVar1 | 1;
                bVar19 = false;
                Curl_infof(data,"Proxy CONNECT connection closed\n");
              }
              datap->keepon = 0;
              goto LAB_00135fc1;
            }
            if (1 < datap->keepon) break;
            size = (long)datap->perline + 1;
            datap->perline = (int)size;
            if (*datap->ptr == '\n') {
              uVar15 = *(ulong *)&(data->set).field_0x8e8;
              if (((uint)uVar15 >> 0x1e & 1) != 0) {
                Curl_debug(data,CURLINFO_HEADER_IN,datap->line_start,size);
                uVar15 = *(ulong *)&(data->set).field_0x8e8;
                size = (size_t)(uint)datap->perline;
              }
              iVar8 = (int)size;
              if ((uVar15 >> 0x31 & 1) == 0) {
                CVar7 = Curl_client_write(conn,(((uint)uVar15 >> 0x19 & 1) != 0) + 2,
                                          datap->line_start,(long)iVar8);
                if (CVar7 != CURLE_OK) goto LAB_001360ad;
                iVar8 = *local_50;
              }
              lVar16 = (long)iVar8;
              pcVar2 = &(data->info).header_size;
              *pcVar2 = *pcVar2 + lVar16;
              pcVar2 = &(data->req).headerbytecount;
              *pcVar2 = *pcVar2 + lVar16;
              cVar3 = *datap->line_start;
              if ((cVar3 == '\r') || (cVar3 == '\n')) {
                datap->ptr = datap->connect_buffer;
                if ((*local_80 == 0x197) && (((data->state).field_0x514 & 0x20) == 0)) {
                  datap->keepon = 2;
                  if (datap->cl == 0) {
                    if ((datap->field_0x4024 & 1) == 0) goto LAB_00135d6d;
                    Curl_infof(data,"Ignore chunked response-body\n");
                    puVar1 = &(data->req).field_0x570;
                    *puVar1 = *puVar1 | 8;
                    pcVar11 = datap->line_start;
                    if (pcVar11[1] == '\n') {
                      pcVar11 = pcVar11 + 1;
                      datap->line_start = pcVar11;
                    }
                    CVar9 = Curl_httpchunk_read(conn,pcVar11 + 1,1,(ssize_t *)&req_buffer,
                                                (CURLcode *)&tookcareof);
                    if (CVar9 == CHUNKE_STOP) {
                      Curl_infof(data,"chunk reading DONE\n");
                      datap->keepon = 0;
                      datap->tunnel_state = TUNNEL_COMPLETE;
                    }
                  }
                  else {
                    Curl_infof(data,"Ignore %ld bytes of response-body\n");
                  }
                }
                else {
LAB_00135d6d:
                  datap->keepon = 0;
                }
                if (*local_68 == 0) {
LAB_00135d84:
                  datap->tunnel_state = TUNNEL_COMPLETE;
                }
              }
              else {
                local_70 = (char *)CONCAT44(local_70._4_4_,remote_port);
                datap->line_start[lVar16] = '\0';
                iVar8 = curl_strnequal("WWW-Authenticate:",datap->line_start,0x11);
                if ((iVar8 == 0) || (*local_80 != 0x191)) {
                  iVar8 = curl_strnequal("Proxy-authenticate:",datap->line_start,0x13);
                  if ((iVar8 != 0) && (_Var4 = true, *local_80 == 0x197)) goto LAB_00135cdc;
                  iVar8 = curl_strnequal("Content-Length:",datap->line_start,0xf);
                  if (iVar8 == 0) {
                    _Var4 = Curl_compareheader(datap->line_start,"Connection:","close");
                    if (_Var4) {
LAB_00135db6:
                      datap->field_0x4024 = datap->field_0x4024 | 2;
                    }
                    else {
                      iVar8 = curl_strnequal("Transfer-Encoding:",datap->line_start,0x12);
                      if (iVar8 == 0) {
                        _Var4 = Curl_compareheader(datap->line_start,"Proxy-Connection:","close");
                        if (_Var4) goto LAB_00135db6;
                        iVar8 = __isoc99_sscanf(datap->line_start,"HTTP/1.%d %d",&subversion,
                                                local_80);
                        if (iVar8 == 2) {
                          (data->info).httpproxycode = (data->req).httpcode;
                        }
                      }
                      else {
                        if (*local_80 - 200U < 100) {
                          pcVar11 = "Ignoring Transfer-Encoding in CONNECT %03d response\n";
                          goto LAB_00135d56;
                        }
                        _Var4 = Curl_compareheader(datap->line_start,"Transfer-Encoding:","chunked")
                        ;
                        if (_Var4) {
                          Curl_infof(data,"CONNECT responded chunked\n");
                          datap->field_0x4024 = datap->field_0x4024 | 1;
                          Curl_httpchunk_init(conn);
                        }
                      }
                    }
                  }
                  else if (*local_80 - 200U < 100) {
                    pcVar11 = "Ignoring Content-Length in CONNECT %03d response\n";
LAB_00135d56:
                    Curl_infof(data,pcVar11);
                  }
                  else {
                    curlx_strtoofft(datap->line_start + 0xf,(char **)0x0,10,local_68);
                  }
                }
                else {
                  _Var4 = false;
LAB_00135cdc:
                  pcVar11 = Curl_copy_header_value(datap->line_start);
                  if (pcVar11 == (char *)0x0) {
                    CVar7 = CURLE_OUT_OF_MEMORY;
                    goto LAB_001360ad;
                  }
                  CVar7 = Curl_http_input_auth(conn,_Var4,pcVar11);
                  (*Curl_cfree)(pcVar11);
                  if (CVar7 != CURLE_OK) goto LAB_001360ad;
                }
                datap->perline = 0;
                datap->ptr = datap->connect_buffer;
                datap->line_start = datap->connect_buffer;
                remote_port = (uint)local_70;
              }
            }
            else {
              datap->ptr = datap->ptr + 1;
            }
          }
          datap->ptr = datap->connect_buffer;
          lVar16 = datap->cl;
          if (lVar16 == 0) {
            tookcareof = 0;
            CVar9 = Curl_httpchunk_read(conn,datap->connect_buffer,1,&tookcareof,&extra);
            if (CVar9 == CHUNKE_STOP) {
              Curl_infof(data,"chunk reading DONE\n");
              datap->keepon = 0;
              goto LAB_00135d84;
            }
            goto LAB_00135a89;
          }
          *local_68 = lVar16 + -1;
        } while (1 < lVar16);
        datap->keepon = 0;
        datap->tunnel_state = TUNNEL_COMPLETE;
LAB_00135fbe:
        bVar19 = false;
LAB_00135fc1:
        iVar8 = Curl_pgrsUpdate(conn);
        if ((bVar19) || (iVar8 != 0)) {
          CVar7 = CURLE_RECV_ERROR;
          if (iVar8 != 0) {
            CVar7 = CURLE_ABORTED_BY_CALLBACK;
          }
          goto LAB_001360ad;
        }
        if ((data->info).httpproxycode - 200U < 100) {
          bVar5 = datap->field_0x4024;
        }
        else {
          CVar7 = Curl_http_auth_act(conn);
          if (CVar7 != CURLE_OK) goto LAB_001360ad;
          bVar5 = datap->field_0x4024;
          if (((conn->bits).field_0x4 & 1) != 0) {
            bVar5 = bVar5 | 2;
            datap->field_0x4024 = bVar5;
          }
        }
        lVar16 = local_58;
        pcVar11 = (data->req).newurl;
        if ((bVar5 & 2) != 0) {
          if (pcVar11 != (char *)0x0) {
            Curl_closesocket(conn,conn->sock[local_58]);
            conn->sock[lVar16] = -1;
          }
          goto LAB_00136113;
        }
        if (pcVar11 == (char *)0x0) goto LAB_00136113;
        aVar6 = datap->tunnel_state;
      } while (aVar6 != TUNNEL_COMPLETE);
      connect_init(conn,true);
    } while ((data->req).newurl != (char *)0x0);
LAB_00136113:
    if ((data->info).httpproxycode - 200U < 100) {
      datap->tunnel_state = TUNNEL_COMPLETE;
      (*Curl_cfree)((conn->allocptr).proxyuserpwd);
      (conn->allocptr).proxyuserpwd = (char *)0x0;
      (data->state).authproxy.field_0x18 = ((data->state).authproxy.field_0x18 & 0xfc) + 1;
      Curl_infof(data,"Proxy replied %d to CONNECT request\n",
                 (ulong)(uint)(data->info).httpproxycode);
      puVar1 = &(data->req).field_0x570;
      *puVar1 = *puVar1 & 0xf7;
      puVar1 = &(conn->bits).field_0x6;
      *puVar1 = *puVar1 & 0xfd;
    }
    else {
      pcVar11 = (data->req).newurl;
      if (pcVar11 == (char *)0x0 || (datap->field_0x4024 & 2) == 0) {
        (*Curl_cfree)(pcVar11);
        (data->req).newurl = (char *)0x0;
        Curl_conncontrol(conn,2);
        lVar16 = local_58;
        Curl_closesocket(conn,conn->sock[local_58]);
        conn->sock[lVar16] = -1;
      }
      else {
        puVar1 = &(conn->bits).field_0x7;
        *puVar1 = *puVar1 | 1;
        Curl_infof(data,"Connect me again please\n");
        connect_done(conn);
      }
      datap->tunnel_state = TUNNEL_INIT;
      if (((conn->bits).field_0x7 & 1) == 0) {
        Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                   (ulong)(uint)(data->req).httpcode);
LAB_001360a5:
        CVar7 = CURLE_RECV_ERROR;
        goto LAB_001360ad;
      }
    }
  }
LAB_00135726:
  CVar7 = CURLE_OK;
  if ((conn->connect_state != (http_connect_state *)0x0) &&
     (conn->connect_state->tunnel_state != TUNNEL_COMPLETE)) {
    return CURLE_OK;
  }
LAB_001360ad:
  connect_done(conn);
  return CVar7;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  if(!conn->connect_state) {
    result = connect_init(conn, FALSE);
    if(result)
      return result;
  }
  result = CONNECT(conn, sockindex, hostname, remote_port);

  if(result || Curl_connect_complete(conn))
    connect_done(conn);

  return result;
}